

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O3

void __thiscall QHexView::mouseMoveEvent(QHexView *this,QMouseEvent *e)

{
  QHexArea QVar1;
  QCursor *pQVar2;
  QPoint pt;
  QPoint pt_00;
  QHexCursor *this_00;
  fd_set *in_R8;
  timeval *in_R9;
  double dVar3;
  double in_XMM1_Qa;
  QHexPosition QVar4;
  QCursor local_30 [8];
  
  QAbstractScrollArea::mouseMoveEvent((QMouseEvent *)this);
  if ((this->m_hexdocument != (QHexDocument *)0x0) && (this->m_hexcursor != (QHexCursor *)0x0)) {
    e[0xc] = (QMouseEvent)0x1;
    dVar3 = (double)QEventPoint::position();
    pt.xp = (int)((double)((ulong)dVar3 & 0x8000000000000000 | 0x3fe0000000000000) + dVar3);
    pt.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa
                 );
    QVar1 = areaFromPoint(this,pt);
    pQVar2 = (QCursor *)QAbstractScrollArea::viewport();
    if (QVar1 == Address) {
      QCursor::QCursor(local_30,ArrowCursor);
      QWidget::setCursor(pQVar2);
    }
    else {
      if (QVar1 == Header) {
        QCursor::QCursor(local_30,ArrowCursor);
        QWidget::setCursor(pQVar2);
        QCursor::~QCursor(local_30);
        return;
      }
      QCursor::QCursor(local_30,IBeamCursor);
      QWidget::setCursor(pQVar2);
    }
    QCursor::~QCursor(local_30);
    if (*(int *)(e + 0x44) == 1) {
      dVar3 = (double)QEventPoint::position();
      pt_00.xp = (int)((double)((ulong)dVar3 & 0x8000000000000000 | 0x3fe0000000000000) + dVar3);
      pt_00.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                      in_XMM1_Qa);
      QVar4 = positionFromPoint(this,pt_00);
      if (-1 < (long)(QVar4.line | (ulong)QVar4.column)) {
        if ((QVar1 & ~Address) == Hex) {
          this->m_currentarea = QVar1;
        }
        this_00 = (QHexCursor *)this->m_hexdocument;
        if (this_00 != (QHexCursor *)0x0) {
          this_00 = this->m_hexcursor;
        }
        QHexCursor::select(this_00,(int)QVar4.line,(fd_set *)QVar4.column,
                           (fd_set *)(ulong)(QVar1 & ~Address),in_R8,in_R9);
      }
    }
  }
  return;
}

Assistant:

void QHexView::mouseMoveEvent(QMouseEvent* e) {
    QAbstractScrollArea::mouseMoveEvent(e);
    if(!this->hexCursor())
        return;

    e->accept();
    auto area = this->areaFromPoint(e->pos());

    switch(area) {
        case QHexArea::Header:
            this->viewport()->setCursor(Qt::ArrowCursor);
            return;
        case QHexArea::Address:
            this->viewport()->setCursor(Qt::ArrowCursor);
            break;
        default: this->viewport()->setCursor(Qt::IBeamCursor); break;
    }

    if(e->buttons() == Qt::LeftButton) {
        auto pos = this->positionFromPoint(e->pos());
        if(!pos.isValid())
            return;
        if(area == QHexArea::Ascii || area == QHexArea::Hex)
            m_currentarea = area;
        this->hexCursor()->select(pos);
    }
}